

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void signal_handler(int signo)

{
  mapped_type *this;
  int local_c [2];
  int signo_local;
  
  local_c[0] = signo;
  this = std::
         unordered_map<int,_std::function<void_()>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::function<void_()>_>_>_>
         ::operator[](&functors,local_c);
  std::function<void_()>::operator()(this);
  return;
}

Assistant:

static void signal_handler(int signo) { functors[signo](); }